

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

bool __thiscall
QScrollerPrivate::moveWhilePressed(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  bool bVar1;
  bool bVar2;
  QScrollerPropertiesPrivate *this_00;
  qint64 in_RDX;
  QPointF *in_RSI;
  QScrollerPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar3;
  double dVar4;
  double dVar5;
  bool canScrollY;
  bool canScrollX;
  bool moveStarted;
  bool moveAborted;
  QScrollerPropertiesPrivate *sp;
  QScroller *q;
  QRectF max;
  QPointF deltaPixel;
  QPointF ppm;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  QPointF *in_stack_ffffffffffffff00;
  QPointF *p2;
  QPointF *in_stack_ffffffffffffff08;
  QScrollerPrivate *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff2d;
  byte bVar7;
  undefined1 in_stack_ffffffffffffff2e;
  byte bVar8;
  byte bVar9;
  QScrollerPrivate *this_01;
  QPointF local_98;
  undefined1 in_stack_ffffffffffffff78 [16];
  State newstate;
  double local_68;
  double local_60;
  QRectF local_58;
  QPointF local_38;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  newstate = in_stack_ffffffffffffff78._12_4_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  q_func(in_RDI);
  this_00 = QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
            ::data(&(in_RDI->properties).d);
  local_18.yp = -NAN;
  local_18.xp = -NAN;
  local_18 = QScroller::pixelPerMeter((QScroller *)this_00);
  local_28.yp = -NAN;
  local_28.xp = -NAN;
  local_28 = ::operator-(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar9 = 0;
  local_38 = operator/((QPointF *)
                       (ulong)CONCAT16(in_stack_ffffffffffffff2e,
                                       CONCAT15(in_stack_ffffffffffffff2d,
                                                CONCAT14(in_stack_ffffffffffffff2c,
                                                         in_stack_ffffffffffffff28))),
                       (QPointF *)in_RDI);
  qVar3 = QPointF::manhattanLength(in_stack_ffffffffffffff08);
  bVar2 = qVar3 != this_00->dragStartDistance;
  bVar1 = this_00->dragStartDistance <= qVar3;
  bVar8 = bVar1 && bVar2;
  if (bVar1 && bVar2) {
    local_58.xp = (in_RDI->contentPosRange).xp;
    local_58.yp = (in_RDI->contentPosRange).yp;
    local_58.w = (in_RDI->contentPosRange).w;
    local_58.h = (in_RDI->contentPosRange).h;
    qVar3 = QRectF::width(&local_58);
    bVar7 = 0.0 < qVar3;
    qVar3 = QRectF::height(&local_58);
    if (this_00->hOvershootPolicy == OvershootAlwaysOn) {
      bVar7 = 1;
    }
    bVar6 = this_00->vOvershootPolicy == OvershootAlwaysOn || 0.0 < qVar3;
    in_stack_ffffffffffffff08 = (QPointF *)QPointF::x(&local_28);
    qVar3 = QPointF::x(&local_18);
    local_60 = (double)in_stack_ffffffffffffff08 / qVar3;
    dVar4 = qAbs<double>(&local_60);
    in_stack_ffffffffffffff10 = (QScrollerPrivate *)QPointF::y(&local_28);
    qVar3 = QPointF::y(&local_18);
    local_68 = (double)in_stack_ffffffffffffff10 / qVar3;
    dVar5 = qAbs<double>(&local_68);
    if (dVar5 <= dVar4) {
      if ((bVar7 & 1) == 0) {
        bVar9 = 1;
      }
    }
    else if ((bVar6 & 1) == 0) {
      bVar9 = 1;
    }
  }
  if ((bVar9 & 1) == 0) {
    if ((bVar8 & 1) != 0) {
      setState(in_stack_ffffffffffffff10,newstate);
      p2 = (QPointF *)this_00->dragStartDistance;
      QPointF::manhattanLength(in_stack_ffffffffffffff08);
      ::operator*(in_stack_ffffffffffffff08,(qreal)p2);
      local_28 = ::operator-(in_stack_ffffffffffffff08,p2);
      QPointF::QPointF(&local_98,0.0,0.0);
      bVar2 = ::operator!=(p2,(QPointF *)
                              CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      if (bVar2) {
        ::operator+(in_stack_ffffffffffffff08,p2);
        handleDrag(this_01,in_RSI,in_RDX);
      }
    }
  }
  else {
    setState(in_stack_ffffffffffffff10,newstate);
    bVar8 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar8 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QScrollerPrivate::moveWhilePressed(const QPointF &position, qint64 timestamp)
{
    Q_Q(QScroller);
    const QScrollerPropertiesPrivate *sp = properties.d.data();
    QPointF ppm = q->pixelPerMeter();

    QPointF deltaPixel = position - pressPosition;

    bool moveAborted = false;
    bool moveStarted = (((deltaPixel / ppm).manhattanLength()) > sp->dragStartDistance);

    // check the direction of the mouse drag and abort if it's too much in the wrong direction.
    if (moveStarted) {
        QRectF max = contentPosRange;
        bool canScrollX = (max.width() > 0);
        bool canScrollY = (max.height() > 0);

        if (sp->hOvershootPolicy == QScrollerProperties::OvershootAlwaysOn)
            canScrollX = true;
        if (sp->vOvershootPolicy == QScrollerProperties::OvershootAlwaysOn)
            canScrollY = true;

        if (qAbs(deltaPixel.x() / ppm.x()) < qAbs(deltaPixel.y() / ppm.y())) {
            if (!canScrollY)
                moveAborted = true;
        } else {
            if (!canScrollX)
                moveAborted = true;
        }
    }

    if (moveAborted) {
        setState(QScroller::Inactive);
        moveStarted = false;

    } else if (moveStarted) {
        setState(QScroller::Dragging);

        // subtract the dragStartDistance
        deltaPixel = deltaPixel - deltaPixel * (sp->dragStartDistance / deltaPixel.manhattanLength());

        if (deltaPixel != QPointF(0, 0)) {
            // handleDrag updates lastPosition, lastTimestamp and velocity
            handleDrag(pressPosition + deltaPixel, timestamp);
        }
    }
    return moveStarted;
}